

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O0

u8 read_joyp_p10_p13(Emulator *e)

{
  Bool BVar1;
  Bool BVar2;
  Bool local_28;
  Bool down;
  Bool up;
  Bool right;
  Bool left;
  u8 result;
  Emulator *e_local;
  
  if ((e->state).joyp.joypad_select == JOYPAD_SELECT_NONE) {
    e_local._7_1_ = (e->state).sgb.current_player & 3 ^ 0xff;
  }
  else if ((e->state).sgb.current_player == '\0') {
    right._3_1_ = FALSE >> 0x18;
    if (((e->state).joyp.joypad_select == JOYPAD_SELECT_BUTTONS) ||
       ((e->state).joyp.joypad_select == JOYPAD_SELECT_BOTH)) {
      right._3_1_ = (char)(((e->state).joyp.buttons.start & TRUE) << 3) |
                    (char)(((e->state).joyp.buttons.select & TRUE) << 2) |
                    (char)(((e->state).joyp.buttons.B & TRUE) << 1) |
                    (char)(e->state).joyp.buttons.A & 1;
    }
    up = (e->state).joyp.buttons.left;
    BVar1 = (e->state).joyp.buttons.right;
    local_28 = (e->state).joyp.buttons.up;
    BVar2 = (e->state).joyp.buttons.down;
    if ((e->config).allow_simulataneous_dpad_opposites == FALSE) {
      if ((up == FALSE) || (BVar1 == FALSE)) {
        if ((local_28 != FALSE) && (BVar2 != FALSE)) {
          local_28 = FALSE;
        }
      }
      else {
        up = FALSE;
      }
    }
    if (((e->state).joyp.joypad_select == JOYPAD_SELECT_DPAD) ||
       ((e->state).joyp.joypad_select == JOYPAD_SELECT_BOTH)) {
      right._3_1_ = right._3_1_ |
                    (char)((BVar2 & TRUE) << 3) | (char)((local_28 & TRUE) << 2) |
                    (char)((up & TRUE) << 1) | (char)BVar1 & 1;
    }
    e_local._7_1_ = right._3_1_ ^ 0xff;
  }
  else {
    e_local._7_1_ = 0xff;
  }
  return e_local._7_1_;
}

Assistant:

static u8 read_joyp_p10_p13(Emulator* e) {
  if (JOYP.joypad_select == JOYPAD_SELECT_NONE) {
    return ~(SGB.current_player & 3);
  }
  if (SGB.current_player != 0) { return ~0; }  // Ignore other controllers.

  u8 result = 0;
  if (JOYP.joypad_select == JOYPAD_SELECT_BUTTONS ||
      JOYP.joypad_select == JOYPAD_SELECT_BOTH) {
    result |= PACK(JOYP.buttons.start, JOYP_BUTTON_START) |
              PACK(JOYP.buttons.select, JOYP_BUTTON_SELECT) |
              PACK(JOYP.buttons.B, JOYP_BUTTON_B) |
              PACK(JOYP.buttons.A, JOYP_BUTTON_A);
  }

  Bool left = JOYP.buttons.left;
  Bool right = JOYP.buttons.right;
  Bool up = JOYP.buttons.up;
  Bool down = JOYP.buttons.down;
  if (!e->config.allow_simulataneous_dpad_opposites) {
    if (left && right) {
      left = FALSE;
    } else if (up && down) {
      up = FALSE;
    }
  }

  if (JOYP.joypad_select == JOYPAD_SELECT_DPAD ||
      JOYP.joypad_select == JOYPAD_SELECT_BOTH) {
    result |= PACK(down, JOYP_DPAD_DOWN) | PACK(up, JOYP_DPAD_UP) |
              PACK(left, JOYP_DPAD_LEFT) | PACK(right, JOYP_DPAD_RIGHT);
  }
  /* The bits are low when the buttons are pressed. */
  return ~result;
}